

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O0

void __thiscall
cmSourceGroup::cmSourceGroup(cmSourceGroup *this,char *name,char *regex,char *parentName)

{
  cmSourceGroupInternals *this_00;
  allocator local_29;
  char *local_28;
  char *parentName_local;
  char *regex_local;
  char *name_local;
  cmSourceGroup *this_local;
  
  local_28 = parentName;
  parentName_local = regex;
  regex_local = name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,name,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::__cxx11::string::string((string *)&this->FullName);
  cmsys::RegularExpression::RegularExpression(&this->GroupRegex);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->GroupFiles);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            (&this->SourceFiles);
  this_00 = (cmSourceGroupInternals *)operator_new(0x18);
  cmSourceGroupInternals::cmSourceGroupInternals(this_00);
  this->Internal = this_00;
  SetGroupRegex(this,parentName_local);
  if (local_28 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->FullName,local_28);
    std::__cxx11::string::operator+=((string *)&this->FullName,"\\");
  }
  std::__cxx11::string::operator+=((string *)&this->FullName,(string *)this);
  return;
}

Assistant:

cmSourceGroup::cmSourceGroup(const char* name, const char* regex,
                             const char* parentName): Name(name)
{
  this->Internal = new cmSourceGroupInternals;
  this->SetGroupRegex(regex);
  if(parentName)
    {
    this->FullName = parentName;
    this->FullName += "\\";
    }
  this->FullName += this->Name;
}